

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O0

int ARKodeSPRKTable_ToButcher
              (ARKodeSPRKTable sprk_table,ARKodeButcherTable *a_ptr,ARKodeButcherTable *b_ptr)

{
  ARKodeButcherTable B;
  ARKodeButcherTable pAVar1;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  int *in_RDI;
  ARKodeButcherTable b;
  ARKodeButcherTable a;
  int j;
  int i;
  int iVar2;
  int iVar3;
  int local_4;
  
  iVar3 = 0;
  iVar2 = 0;
  B = ARKodeButcherTable_Alloc(0,0);
  if (B == (ARKodeButcherTable)0x0) {
    local_4 = -0x14;
  }
  else {
    pAVar1 = ARKodeButcherTable_Alloc(iVar3,iVar2);
    if (pAVar1 == (ARKodeButcherTable)0x0) {
      if (B != (ARKodeButcherTable)0x0) {
        ARKodeButcherTable_Free(B);
      }
      local_4 = -0x14;
    }
    else {
      for (iVar2 = 0; iVar2 < in_RDI[1]; iVar2 = iVar2 + 1) {
        pAVar1->b[iVar2] = *(sunrealtype *)(*(long *)(in_RDI + 4) + (long)iVar2 * 8);
        for (iVar3 = 0; iVar3 <= iVar2; iVar3 = iVar3 + 1) {
          pAVar1->A[iVar2][iVar3] = *(sunrealtype *)(*(long *)(in_RDI + 4) + (long)iVar3 * 8);
        }
        for (iVar2 = 0; iVar2 < in_RDI[1]; iVar2 = iVar2 + 1) {
          for (iVar3 = 0; iVar3 <= iVar2; iVar3 = iVar3 + 1) {
            pAVar1->c[iVar2] =
                 *(double *)(*(long *)(in_RDI + 4) + (long)iVar3 * 8) + pAVar1->c[iVar2];
          }
        }
        for (iVar2 = 0; iVar2 < in_RDI[1]; iVar2 = iVar2 + 1) {
          B->b[iVar2] = *(sunrealtype *)(*(long *)(in_RDI + 2) + (long)iVar2 * 8);
          for (iVar3 = 0; iVar3 < iVar2; iVar3 = iVar3 + 1) {
            B->A[iVar2][iVar3] = *(sunrealtype *)(*(long *)(in_RDI + 2) + (long)iVar3 * 8);
          }
        }
        for (iVar3 = 0; iVar3 < in_RDI[1]; iVar3 = iVar3 + 1) {
          for (iVar2 = 0; iVar2 < iVar3; iVar2 = iVar2 + 1) {
            B->c[iVar3] = *(double *)(*(long *)(in_RDI + 2) + (long)iVar2 * 8) + B->c[iVar3];
          }
        }
        B->q = *in_RDI;
        pAVar1->q = *in_RDI;
        B->p = 0;
        pAVar1->p = 0;
      }
      *in_RSI = B;
      *in_RDX = pAVar1;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKodeSPRKTable_ToButcher(ARKodeSPRKTable sprk_table,
                              ARKodeButcherTable* a_ptr,
                              ARKodeButcherTable* b_ptr)
{
  int i                = 0;
  int j                = 0;
  ARKodeButcherTable a = NULL;
  ARKodeButcherTable b = NULL;

  a = ARKodeButcherTable_Alloc(sprk_table->stages, SUNFALSE);
  if (!a) { return ARK_MEM_FAIL; }
  b = ARKodeButcherTable_Alloc(sprk_table->stages, SUNFALSE);
  if (!b)
  {
    if (a) { ARKodeButcherTable_Free(a); }
    return ARK_MEM_FAIL;
  }

  /* DIRK table */
  for (i = 0; i < sprk_table->stages; ++i)
  {
    b->b[i] = sprk_table->ahat[i];
    for (j = 0; j <= i; ++j) { b->A[i][j] = sprk_table->ahat[j]; }
    /* Time weights: C_j = sum_{i=0}^{j} b_i */

    /* Time weights: C_j = sum_{i=0}^{j-1} b_i */
    for (j = 0; j < sprk_table->stages; ++j)
    {
      for (i = 0; i <= j; ++i) { b->c[j] += sprk_table->ahat[i]; }
    }

    /* Explicit table */
    for (i = 0; i < sprk_table->stages; ++i)
    {
      a->b[i] = sprk_table->a[i];
      for (j = 0; j < i; ++j) { a->A[i][j] = sprk_table->a[j]; }
    }

    /* Time weights: c_j = sum_{i=0}^{j-1} a_i */
    for (j = 0; j < sprk_table->stages; ++j)
    {
      for (i = 0; i < j; ++i) { a->c[j] += sprk_table->a[i]; }
    }

    /* Set method order */
    a->q = sprk_table->q;
    b->q = sprk_table->q;

    /* No embedding, so set embedding order to 0 */
    a->p = 0;
    b->p = 0;
  }

  *a_ptr = a;
  *b_ptr = b;

  return ARK_SUCCESS;
}